

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyValueFile.h
# Opt level: O2

bool __thiscall KeyValueFile::includeFile(KeyValueFile *this,char *inc_file_name,int include_depth)

{
  PrintErrorFunc p_Var1;
  pointer pcVar2;
  uint uVar3;
  value_type *pvVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  StringKeyValue *value;
  value_type *__x;
  string combinedFileName;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  value_type *local_60;
  value_type *pvStack_58;
  pointer local_50;
  int local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (include_depth < 0x10) {
    pcVar2 = (this->fileName)._M_dataplus._M_p;
    uVar8 = (this->fileName)._M_string_length;
    uVar6 = (uint)uVar8;
    pcVar9 = pcVar2 + (uVar8 & 0xffffffff);
    while( true ) {
      pcVar9 = pcVar9 + -1;
      uVar7 = (uint)uVar8;
      uVar3 = (int)uVar6 >> 0x1f & uVar6;
      if ((int)uVar7 < 1) break;
      uVar8 = (ulong)(uVar7 - 1);
      uVar3 = uVar7;
      if ((*pcVar9 == '\\') || (*pcVar9 == '/')) break;
    }
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,pcVar2,pcVar2 + (int)uVar3);
    std::__cxx11::string::append((char *)&local_a8);
    local_88._8_8_ = &local_70;
    local_88._16_8_ = 0;
    local_70._M_local_buf[0] = '\0';
    local_60 = (value_type *)0x0;
    pvStack_58 = (value_type *)0x0;
    local_50 = (pointer)0x0;
    local_48 = include_depth + 1;
    local_88._0_8_ = this->printErrorFunc;
    bVar5 = loadFromFile((KeyValueFile *)local_88,local_a8._M_dataplus._M_p);
    pvVar4 = pvStack_58;
    if (bVar5) {
      for (__x = local_60; __x != pvVar4; __x = __x + 1) {
        std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>::
        push_back(&this->kv,__x);
      }
    }
    ~KeyValueFile((KeyValueFile *)local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    p_Var1 = this->printErrorFunc;
    if (p_Var1 != (PrintErrorFunc)0x0) {
      std::__cxx11::string::string
                ((string *)&local_40,"ERROR: Maximum include depth exceeded on file \'",&local_a9);
      std::operator+(&local_a8,&local_40,inc_file_name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     &local_a8,"\'\n");
      (*p_Var1)((char *)local_88._0_8_);
      std::__cxx11::string::~string((string *)local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_40);
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool includeFile(const char * inc_file_name, int include_depth)
  {
    if (include_depth >= 16)
    {
      if (printErrorFunc)
        printErrorFunc(
          (std::string("ERROR: Maximum include depth exceeded on file '") + inc_file_name + "'\n").c_str());
      return false;
    }

    int len = int(fileName.length()) - 1;
    while (len >= 0)
    {
      if (fileName[len] == '\\' || fileName[len] == '/')
        break;
      len--;
    }

    std::string combinedFileName(fileName.c_str(), len + 1);
    combinedFileName += inc_file_name;

    KeyValueFile kvFile;
    kvFile.includeDepth = include_depth + 1;
    kvFile.printErrorFunc = printErrorFunc;

    bool ok = kvFile.loadFromFile(combinedFileName.c_str());

    if (ok)
      for (auto && value : kvFile.kv)
        kv.push_back(value);

    return ok;
  }